

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.hpp
# Opt level: O0

void __thiscall antlr::BaseAST::addChild(BaseAST *this,RefAST *c)

{
  AST *pAVar1;
  BaseAST *pBVar2;
  BaseAST *other;
  ASTRefCount *in_RSI;
  RefBaseAST tmp;
  AST *in_stack_ffffffffffffff88;
  AST *in_stack_ffffffffffffff90;
  ASTRefCount<antlr::BaseAST> local_18 [3];
  
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar1 != (AST *)0x0) {
    ASTRefCount<antlr::BaseAST>::ASTRefCount
              ((ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff90,
               (ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff88);
    pBVar2 = ASTRefCount::operator_cast_to_BaseAST_((ASTRefCount *)local_18);
    if (pBVar2 == (BaseAST *)0x0) {
      ASTRefCount::operator_cast_to_AST_(in_RSI);
      ASTRefCount<antlr::BaseAST>::operator=
                ((ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
    }
    else {
      while( true ) {
        pBVar2 = ASTRefCount<antlr::BaseAST>::operator->(local_18);
        pBVar2 = ASTRefCount::operator_cast_to_BaseAST_((ASTRefCount *)&pBVar2->right);
        if (pBVar2 == (BaseAST *)0x0) break;
        other = ASTRefCount<antlr::BaseAST>::operator->(local_18);
        ASTRefCount<antlr::BaseAST>::operator=
                  ((ASTRefCount<antlr::BaseAST> *)pBVar2,(ASTRefCount<antlr::BaseAST> *)other);
      }
      in_stack_ffffffffffffff90 = ASTRefCount::operator_cast_to_AST_(in_RSI);
      pBVar2 = ASTRefCount<antlr::BaseAST>::operator->(local_18);
      ASTRefCount<antlr::BaseAST>::operator=
                ((ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff90,&pBVar2->super_AST);
    }
    ASTRefCount<antlr::BaseAST>::~ASTRefCount
              ((ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

virtual void addChild(RefAST c)
	{
		if( !c )
			return;

		RefBaseAST tmp = down;

		if (tmp)
		{
			while (tmp->right)
				tmp = tmp->right;
			tmp->right = c;
		}
		else
			down = c;
	}